

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::SliderCalcRatioFromValueT<unsigned_long_long,double>
                (ImGuiDataType data_type,unsigned_long_long v,unsigned_long_long v_min,
                unsigned_long_long v_max,float power,float linear_zero_pos)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  unsigned_long_long uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  
  fVar8 = 0.0;
  uVar5 = v_max - v_min;
  if (uVar5 != 0) {
    uVar3 = v_max;
    if (v_min < v_max) {
      uVar3 = v_min;
    }
    if (v_max < v_min) {
      v_max = v_min;
    }
    if (v < v_max) {
      v_max = v;
    }
    if (v < uVar3) {
      v_max = uVar3;
    }
    uVar4 = v_max - v_min;
    if (((data_type & 0xfffffffeU) == 8) && ((power != 1.0 || (NAN(power))))) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar4;
      uVar5 = SUB168(auVar2 / auVar1,0);
      if ((long)uVar5 < 0) {
        fVar8 = (float)((ulong)(SUB164(auVar2 / auVar1,0) & 1) | uVar5 >> 1);
        fVar8 = fVar8 + fVar8;
      }
      else {
        fVar8 = (float)(long)uVar5;
      }
      fVar8 = powf(fVar8,1.0 / power);
      return fVar8 * (1.0 - linear_zero_pos) + linear_zero_pos;
    }
    auVar6._8_4_ = (int)(uVar4 >> 0x20);
    auVar6._0_8_ = uVar4;
    auVar6._12_4_ = 0x45300000;
    auVar7._8_4_ = (int)(uVar5 >> 0x20);
    auVar7._0_8_ = uVar5;
    auVar7._12_4_ = 0x45300000;
    fVar8 = (float)(((auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) /
                   ((auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)));
  }
  return fVar8;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}